

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.hpp
# Opt level: O2

cx_string<7UL>
mserialize::detail::
BuiltinTag<std::tuple<int,_bool,_char,_std::vector<int,_std::allocator<int>_>_>,_void>::tag_string
          (void)

{
  cx_string<2UL> cVar1;
  cx_string<7UL> cVar2;
  cx_string<1UL> local_2e;
  cx_string<1UL> local_2c;
  cx_string<1UL> local_2a;
  cx_string<1UL> local_28;
  cx_string<1UL> local_26;
  cx_string<2UL> local_24;
  
  local_26._data[0] = '(';
  local_26._data[1] = '\0';
  local_28._data[0] = 'i';
  local_28._data[1] = '\0';
  local_2a._data[0] = 'y';
  local_2a._data[1] = '\0';
  local_2c._data[0] = 'c';
  local_2c._data[1] = '\0';
  cVar1 = BuiltinTag<std::vector<int,_std::allocator<int>_>,_void>::tag_string();
  local_24._data._0_2_ = cVar1._data._0_2_;
  local_24._data[2] = cVar1._data[2];
  local_2e._data[0] = ')';
  local_2e._data[1] = '\0';
  cVar2 = cx_strcat<1ul,1ul,1ul,1ul,2ul,1ul>
                    (&local_26,&local_28,&local_2a,&local_2c,&local_24,&local_2e);
  return (cx_string<7UL>)cVar2._data;
}

Assistant:

static constexpr auto tag_string()
  {
    return cx_strcat(
      make_cx_string("("),
      Tag<E>::type::tag_string()...,
      make_cx_string(")")
    );
  }